

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo(GreaterThanOrEqualTo<int> *this,int rhs)

{
  ostream *this_00;
  int in_ESI;
  string *in_RDI;
  stringstream iss;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_> *)0x2f0ae8);
  *(int *)(in_RDI + 0x20) = local_c;
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = std::operator<<(local_188,"greater than or equal to");
  std::ostream::operator<<(this_00,local_c);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

GreaterThanOrEqualTo(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "greater than or equal to" << rhs;
      this->description_ = iss.str();
    }